

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O3

bool __thiscall
glcts::DrawBuffersIndexedColorMasks::VerifyImg
          (DrawBuffersIndexedColorMasks *this,TextureLevel *textureLevel,RGBA expectedColor,
          RGBA epsilon)

{
  ostringstream *this_00;
  ChannelOrder CVar1;
  bool bVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ChannelOrder CVar7;
  ChannelOrder CVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ChannelOrder CVar13;
  uint uVar14;
  ChannelOrder CVar15;
  uint uVar16;
  IVec4 color;
  int local_1e8;
  undefined1 local_1d0 [24];
  TextureLevel *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar12 = (textureLevel->m_size).m_data[1];
  if (0 < iVar12) {
    uVar4 = expectedColor.m_value >> 8 & 0xff;
    uVar5 = expectedColor.m_value >> 0x10 & 0xff;
    iVar6 = (textureLevel->m_size).m_data[0];
    local_1e8 = 0;
    local_1d0._16_8_ = this;
    local_1b8 = textureLevel;
    do {
      if (0 < iVar6) {
        iVar12 = 0;
        do {
          tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,textureLevel);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1d0,(int)(ConstPixelBufferAccess *)local_1b0,
                     iVar12,local_1e8);
          CVar15 = local_1d0._4_4_ << 8 | local_1d0._0_4_;
          CVar13 = local_1d0._8_4_ << 0x10 | local_1d0._12_4_ << 0x18 | CVar15;
          if (CVar13 != expectedColor.m_value) {
            CVar7 = local_1d0._0_4_ & 0xff;
            CVar8 = CVar7 - (expectedColor.m_value & 0xff);
            CVar1 = -CVar8;
            if (0 < (int)CVar8) {
              CVar1 = CVar8;
            }
            uVar16 = CVar15 >> 8 & 0xff;
            iVar9 = uVar16 - uVar4;
            iVar6 = -iVar9;
            if (0 < iVar9) {
              iVar6 = iVar9;
            }
            uVar14 = CVar13 >> 0x10 & 0xff;
            iVar10 = uVar14 - uVar5;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            iVar11 = (CVar13 >> 0x18) - (expectedColor.m_value >> 0x18);
            iVar10 = -iVar11;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            local_1b0._0_4_ = iVar9 << 0x10 | iVar6 << 8 | CVar1 | iVar10 << 0x18;
            bVar2 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,epsilon);
            if (!bVar2) {
              local_1b0._0_8_ =
                   ((((DrawBuffersIndexedBase *)local_1d0._16_8_)->super_TestCaseBase).
                    super_TestCase.super_TestNode.m_testCtx)->m_log;
              this_00 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"Expected value: ",0x10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
              poVar3 = (ostream *)std::ostream::operator<<(this_00,expectedColor.m_value & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,expectedColor.m_value >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"Read value:     ",0x10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
              poVar3 = (ostream *)std::ostream::operator<<(this_00,CVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,CVar13 >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"Epsilon:        ",0x10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
              poVar3 = (ostream *)std::ostream::operator<<(this_00,epsilon.m_value & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,epsilon.m_value >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,epsilon.m_value >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,epsilon.m_value >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
              return false;
            }
          }
          iVar12 = iVar12 + 1;
          iVar6 = (local_1b8->m_size).m_data[0];
          textureLevel = local_1b8;
        } while (iVar12 < iVar6);
        iVar12 = (local_1b8->m_size).m_data[1];
      }
      local_1e8 = local_1e8 + 1;
    } while (local_1e8 < iVar12);
  }
  return true;
}

Assistant:

bool DrawBuffersIndexedColorMasks::VerifyImg(const tcu::TextureLevel& textureLevel, tcu::RGBA expectedColor,
											 tcu::RGBA epsilon)
{
	for (int y = 0; y < textureLevel.getHeight(); ++y)
	{
		for (int x = 0; x < textureLevel.getWidth(); ++x)
		{
			tcu::IVec4 color(textureLevel.getAccess().getPixelInt(x, y));
			tcu::RGBA  pixel(color.x(), color.y(), color.z(), color.w());

			if (!tcu::compareThreshold(pixel, expectedColor, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected value: " << expectedColor << "\n"
								   << "Read value:     " << pixel << "\n"
								   << "Epsilon:        " << epsilon << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}
	return true;
}